

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

size_t ntru_encode_schedule_length(NTRUEncodeSchedule *sched)

{
  ulong local_20;
  size_t i;
  size_t len;
  NTRUEncodeSchedule *sched_local;
  
  i = 0;
  for (local_20 = 0; local_20 < sched->nops; local_20 = local_20 + 1) {
    if (sched->ops[local_20] == 1) {
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t ntru_encode_schedule_length(NTRUEncodeSchedule *sched)
{
    size_t len = 0;
    for (size_t i = 0; i < sched->nops; i++)
        if (sched->ops[i] == ENC_BYTE)
            len++;
    return len;
}